

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

void dam_message(CHAR_DATA *ch,CHAR_DATA *victim,int dam,int dt,bool immune,char *dnoun,bool reduced
                )

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  OBJ_DATA *pOVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char **ppcVar8;
  size_t sVar9;
  undefined4 uVar10;
  CHAR_DATA *pCVar11;
  char *__format;
  int iVar12;
  char *pcVar13;
  char buf2 [256];
  char buf1 [256];
  char buf3 [256];
  char buf97 [256];
  char *in_stack_fffffffffffffb78;
  undefined8 uVar14;
  undefined4 uVar15;
  char *local_478;
  byte local_46c;
  char local_438 [8];
  char acStack_430 [8];
  char local_428 [8];
  char acStack_420 [8];
  undefined1 local_418;
  char local_338 [8];
  char acStack_330 [8];
  char local_328 [8];
  char acStack_320 [8];
  undefined4 local_318;
  char local_238 [256];
  char local_138 [264];
  
  iVar12 = 0;
  if (0 < dam) {
    iVar12 = dam;
  }
  if (victim == (CHAR_DATA *)0x0 || ch == (CHAR_DATA *)0x0) {
    return;
  }
  if (victim->in_room == (ROOM_INDEX_DATA *)0x0) {
    return;
  }
  if (ch->in_room == (ROOM_INDEX_DATA *)0x0) {
    return;
  }
  if (reduced) {
    local_478 = "\x1b[0mfails to harm";
    pcVar13 = "\x1b[0mfail to harm";
  }
  else if (dam < 1) {
    local_478 = "misses";
    pcVar13 = "miss";
  }
  else if ((uint)dam < 3) {
    local_478 = "scratches";
    pcVar13 = "scratch";
  }
  else if ((uint)dam < 5) {
    local_478 = "grazes";
    pcVar13 = "graze";
  }
  else if ((uint)dam < 8) {
    local_478 = "hits";
    pcVar13 = "hit";
  }
  else if ((uint)dam < 0xc) {
    local_478 = "injures";
    pcVar13 = "injure";
  }
  else if ((uint)dam < 0x10) {
    local_478 = "wounds";
    pcVar13 = "wound";
  }
  else if ((uint)dam < 0x15) {
    local_478 = "mauls";
    pcVar13 = "maul";
  }
  else if ((uint)dam < 0x1a) {
    local_478 = "decimates";
    pcVar13 = "decimate";
  }
  else if ((uint)dam < 0x1f) {
    local_478 = "devastates";
    pcVar13 = "devastate";
  }
  else if ((uint)dam < 0x26) {
    local_478 = "maims";
    pcVar13 = "maim";
  }
  else if ((uint)dam < 0x2e) {
    local_478 = "MUTILATES";
    pcVar13 = "MUTILATE";
  }
  else if ((uint)dam < 0x38) {
    local_478 = "EVISCERATES";
    pcVar13 = "EVISCERATE";
  }
  else if ((uint)dam < 0x42) {
    local_478 = "DISMEMBERS";
    pcVar13 = "DISMEMBER";
  }
  else if ((uint)dam < 0x56) {
    local_478 = "MASSACRES";
    pcVar13 = "MASSACRE";
  }
  else if ((uint)dam < 0x65) {
    local_478 = "MANGLES";
    pcVar13 = "MANGLE";
  }
  else if ((uint)dam < 0x88) {
    local_478 = "*** DEMOLISHES ***";
    pcVar13 = "*** DEMOLISH ***";
  }
  else if ((uint)dam < 0xa1) {
    local_478 = "*** DEVASTATES ***";
    pcVar13 = "*** DEVASTATE ***";
  }
  else if ((uint)dam < 0xfb) {
    local_478 = "=== OBLITERATES ===";
    pcVar13 = "=== OBLITERATE ===";
  }
  else if ((uint)dam < 0x14b) {
    local_478 = ">>> ANNIHILATES <<<";
    pcVar13 = ">>> ANNIHILATE <<<";
  }
  else {
    pcVar13 = "do UNSPEAKABLE things to";
    if ((uint)dam < 0x17d) {
      pcVar13 = "<<< ERADICATE >>>";
    }
    local_478 = "does UNSPEAKABLE things to";
    if ((uint)dam < 0x17d) {
      local_478 = "<<< ERADICATES >>>";
    }
  }
  uVar10 = 0x21;
  if (dam < 0x22) {
    uVar10 = 0x2e;
  }
  if (gsn_dual_wield == dt) {
    pOVar4 = get_eq_char(ch,0x12);
    if (pOVar4 == (OBJ_DATA *)0x0) {
      dt = (int)ch->dam_type + 1000;
    }
    else {
      dt = pOVar4->value[3] + 1000;
    }
  }
  local_46c = (byte)uVar10;
  if (dt != 1000) {
    if ((uint)dt < 800) {
      ppcVar8 = &skill_table[(uint)dt].noun_damage;
    }
    else if (dt - 1000U < 0x3e) {
      ppcVar8 = &attack_table.super__Vector_base<attack_type,_std::allocator<attack_type>_>._M_impl.
                 super__Vector_impl_data._M_start[dt - 1000U].noun;
    }
    else {
      ppcVar8 = &(attack_table.super__Vector_base<attack_type,_std::allocator<attack_type>_>._M_impl
                  .super__Vector_impl_data._M_start)->noun;
    }
    if (dnoun == (char *)0x0) {
      pcVar5 = *ppcVar8;
    }
    else {
      pcVar5 = palloc_string(dnoun);
    }
    bVar2 = dnoun != (char *)0x0;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)0x0;
      if (!immune) goto LAB_002918e1;
      goto LAB_0029186c;
    }
    sVar9 = strlen(pcVar5);
    if (pcVar5[sVar9 - 1] == '#') {
      pcVar6 = palloc_string(pcVar5);
      chop(pcVar6);
LAB_0029159a:
      if (bVar2) {
        free_pstring(pcVar5);
      }
      pcVar5 = palloc_string(pcVar6);
      free_pstring(pcVar6);
    }
    else if (pcVar5[sVar9 - 1] == '$') {
      pcVar6 = palloc_string(pcVar5);
      chop(pcVar6);
      local_478 = pcVar13;
      goto LAB_0029159a;
    }
    if (immune) {
      if (pcVar5 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        sVar9 = strlen(pcVar5);
        if (pcVar5[sVar9 - 1] == '*') {
          pcVar13 = palloc_string(pcVar5);
          chop(pcVar13);
          if (bVar2) {
            free_pstring(pcVar5);
          }
          pcVar5 = palloc_string(pcVar13);
          free_pstring(pcVar13);
          pcVar13 = "$N is unaffected by %s!";
          sprintf(local_338,"$N is unaffected by %s!",pcVar5);
          if (ch == victim) {
            pcVar13 = "You are unaffected by %s!";
          }
          sprintf(local_438,pcVar13,pcVar5);
          pcVar13 = "You are unaffected by %s!";
LAB_00291cf5:
          sprintf(local_238,pcVar13,pcVar5);
LAB_00291cff:
          bVar1 = true;
          bVar2 = true;
          goto LAB_00291d05;
        }
      }
LAB_0029186c:
      if (ch != victim) {
        sprintf(local_338,"$N is unaffected by $n\'s %s!",pcVar5);
        sprintf(local_438,"$N is unaffected by your %s!",pcVar5);
        pcVar13 = "You are unaffected by $n\'s %s!";
        goto LAB_00291bd9;
      }
      sprintf(local_338,"$n is unaffected by $s %s.",pcVar5);
      pcVar13 = "You are unaffected by your %s.";
      pcVar6 = local_438;
    }
    else {
      if (pcVar5 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        sVar9 = strlen(pcVar5);
        if (pcVar5[sVar9 - 1] == '*') {
          pcVar13 = palloc_string(pcVar5);
          chop(pcVar13);
          if (bVar2) {
            free_pstring(pcVar5);
          }
          pcVar5 = palloc_string(pcVar13);
          free_pstring(pcVar13);
          uVar15 = (undefined4)((ulong)in_stack_fffffffffffffb78 >> 0x20);
          pCVar11 = victim->in_room->people;
          if (pCVar11 != (CHAR_DATA *)0x0) {
            do {
              if (pCVar11 != victim && pCVar11 != ch) {
                if (iVar12 < victim->max_hit) {
                  pcVar13 = get_char_color(pCVar11,"damage");
                  pcVar6 = END_COLOR(pCVar11);
                  in_stack_fffffffffffffb78 = get_descr_form(victim,pCVar11,false);
                  sprintf(local_338,"%s %s%s%s %s%c",pcVar5,pcVar13,local_478,pcVar6,
                          in_stack_fffffffffffffb78,uVar10);
                }
                else {
                  pcVar13 = get_descr_form(victim,pCVar11,false);
                  sprintf(local_338,"%s slays %s outright!",pcVar5,pcVar13);
                }
                act(local_338,ch,(void *)0x0,pCVar11,2);
              }
              uVar15 = (undefined4)((ulong)in_stack_fffffffffffffb78 >> 0x20);
              pCVar11 = pCVar11->next_in_room;
            } while (pCVar11 != (CHAR_DATA *)0x0);
          }
          if (ch == victim) {
            if (victim->max_hit <= iVar12) {
              pcVar13 = "Your %s slays you outright!";
              goto LAB_00291c79;
            }
            pcVar6 = get_char_color(ch,"damage");
            pcVar7 = END_COLOR(ch);
            pcVar13 = "Your %s %s%s%s you%c";
LAB_00291c48:
            uVar14 = CONCAT44(uVar15,uVar10);
            sprintf(local_438,pcVar13 + 5,pcVar5,pcVar6,local_478,pcVar7,uVar14);
            uVar15 = (undefined4)((ulong)uVar14 >> 0x20);
          }
          else {
            if (iVar12 < victim->max_hit) {
              pcVar6 = get_char_color(ch,"damage");
              pcVar7 = END_COLOR(ch);
              pcVar13 = "Your %s %s%s%s $N%c";
              goto LAB_00291c48;
            }
            pcVar13 = "Your %s slays $N outright!";
LAB_00291c79:
            sprintf(local_438,pcVar13 + 5,pcVar5);
          }
          if (victim->max_hit <= iVar12) {
            pcVar13 = "%s slays you outright!";
            goto LAB_00291cf5;
          }
          pcVar13 = get_char_color(victim,"damage");
          pcVar6 = END_COLOR(victim);
          sprintf(local_238,"%s %s%s%s you%c",pcVar5,pcVar13,local_478,pcVar6,
                  CONCAT44(uVar15,uVar10));
          goto LAB_00291cff;
        }
      }
LAB_002918e1:
      uVar15 = (undefined4)((ulong)in_stack_fffffffffffffb78 >> 0x20);
      pCVar11 = victim->in_room->people;
      if (ch == victim) {
        if (pCVar11 != (CHAR_DATA *)0x0) {
          do {
            uVar15 = (undefined4)((ulong)in_stack_fffffffffffffb78 >> 0x20);
            if (pCVar11 != ch) {
              if (iVar12 < victim->max_hit) {
                pcVar13 = get_char_color(pCVar11,"damage");
                pcVar6 = END_COLOR(pCVar11);
                in_stack_fffffffffffffb78 = (char *)CONCAT44(uVar15,uVar10);
                sprintf(local_338,"$n\'s %s %s%s%s $m%c",pcVar5,pcVar13,local_478,pcVar6,
                        in_stack_fffffffffffffb78);
              }
              else {
                sprintf(local_338,"$n\'s %s slays $m outright!",pcVar5);
              }
              act(local_338,ch,(void *)0x0,pCVar11,2);
            }
            uVar15 = (undefined4)((ulong)in_stack_fffffffffffffb78 >> 0x20);
            pCVar11 = pCVar11->next_in_room;
          } while (pCVar11 != (CHAR_DATA *)0x0);
        }
        if (iVar12 < victim->max_hit) {
          pcVar13 = get_char_color(ch,"damage");
          pcVar6 = END_COLOR(ch);
          sprintf(local_438,"Your %s %s%s%s you%c",pcVar5,pcVar13,local_478,pcVar6,
                  CONCAT44(uVar15,uVar10));
        }
        else {
          sprintf(local_438,"Your %s slays you outright!",pcVar5);
        }
        bVar1 = false;
        goto LAB_00291d05;
      }
      if (pCVar11 != (CHAR_DATA *)0x0) {
        do {
          if (pCVar11 != victim && pCVar11 != ch) {
            if (iVar12 < victim->max_hit) {
              pcVar13 = get_char_color(pCVar11,"damage");
              pcVar6 = END_COLOR(pCVar11);
              in_stack_fffffffffffffb78 = get_descr_form(victim,pCVar11,false);
              sprintf(local_338,"$n\'s %s %s%s%s %s%c",pcVar5,pcVar13,local_478,pcVar6,
                      in_stack_fffffffffffffb78,uVar10);
            }
            else {
              pcVar13 = get_descr_form(victim,pCVar11,false);
              sprintf(local_338,"$n\'s %s slays %s outright!",pcVar5,pcVar13);
            }
            act(local_338,ch,(void *)0x0,pCVar11,2);
          }
          uVar15 = (undefined4)((ulong)in_stack_fffffffffffffb78 >> 0x20);
          pCVar11 = pCVar11->next_in_room;
        } while (pCVar11 != (CHAR_DATA *)0x0);
      }
      if (iVar12 < victim->max_hit) {
        pcVar13 = get_char_color(ch,"damage");
        pcVar6 = END_COLOR(ch);
        uVar14 = CONCAT44(uVar15,uVar10);
        sprintf(local_438,"Your %s %s%s%s $N%c",pcVar5,pcVar13,local_478,pcVar6,uVar14);
        uVar15 = (undefined4)((ulong)uVar14 >> 0x20);
      }
      else {
        sprintf(local_438,"Your %s slays $N outright!",pcVar5);
      }
      if (iVar12 < victim->max_hit) {
        pcVar13 = get_char_color(victim,"damage");
        pcVar6 = END_COLOR(victim);
        bVar1 = false;
        sprintf(local_238,"$n\'s %s %s%s%s you%c",pcVar5,pcVar13,local_478,pcVar6,
                CONCAT44(uVar15,uVar10));
        goto LAB_00291d05;
      }
      pcVar13 = "$n\'s %s slays you outright!";
LAB_00291bd9:
      pcVar6 = local_238;
    }
    bVar1 = false;
    sprintf(pcVar6,pcVar13,pcVar5);
    goto LAB_00291d05;
  }
  if (ch == victim) {
    if (iVar12 < victim->max_hit) {
      sprintf(local_338,"$n %s $mself%c",local_478,(ulong)local_46c);
      pcVar6 = get_char_color(ch,"damage");
      pcVar7 = END_COLOR(ch);
      __format = "You %s%s%s yourself%c";
      pcVar5 = local_438;
      goto LAB_00291561;
    }
    local_328[0] = 'y';
    local_328[1] = 's';
    local_328[2] = ' ';
    local_328[3] = '$';
    local_328[4] = 'm';
    local_328[5] = 's';
    local_328[6] = 'e';
    local_328[7] = 'l';
    acStack_320[0] = 'f';
    acStack_320[1] = ' ';
    acStack_320[2] = 'o';
    acStack_320[3] = 'u';
    acStack_320[4] = 't';
    acStack_320[5] = 'r';
    acStack_320[6] = 'i';
    acStack_320[7] = 'g';
    local_338[0] = '$';
    local_338[1] = 'n';
    local_338[2] = '\'';
    local_338[3] = 's';
    local_338[4] = ' ';
    local_338[5] = 'a';
    local_338[6] = 's';
    local_338[7] = 's';
    acStack_330[0] = 'a';
    acStack_330[1] = 'u';
    acStack_330[2] = 'l';
    acStack_330[3] = 't';
    acStack_330[4] = ' ';
    acStack_330[5] = 's';
    acStack_330[6] = 'l';
    acStack_330[7] = 'a';
    local_318 = 0x217468;
    local_438[0] = 'Y';
    local_438[1] = 'o';
    local_438[2] = 'u';
    local_438[3] = 'r';
    local_438[4] = ' ';
    local_438[5] = 'a';
    local_438[6] = 's';
    local_438[7] = 's';
    acStack_430[0] = 'a';
    acStack_430[1] = 'u';
    acStack_430[2] = 'l';
    acStack_430[3] = 't';
    acStack_430[4] = ' ';
    acStack_430[5] = 's';
    acStack_430[6] = 'l';
    acStack_430[7] = 'a';
    local_428[0] = 'y';
    local_428[1] = 's';
    local_428[2] = ' ';
    local_428[3] = 'y';
    local_428[4] = 'o';
    local_428[5] = 'u';
    local_428[6] = ' ';
    local_428[7] = 'o';
    acStack_420[0] = 'u';
    acStack_420[1] = 't';
    acStack_420[2] = 'r';
    acStack_420[3] = 'i';
    acStack_420[4] = 'g';
    acStack_420[5] = 'h';
    acStack_420[6] = 't';
    acStack_420[7] = '!';
    local_418 = 0;
  }
  else {
    pCVar11 = victim->in_room->people;
    if (pCVar11 != (CHAR_DATA *)0x0) {
      do {
        uVar15 = (undefined4)((ulong)in_stack_fffffffffffffb78 >> 0x20);
        if (pCVar11 != victim && pCVar11 != ch) {
          if (iVar12 < victim->max_hit) {
            pcVar5 = get_char_color(pCVar11,"damage");
            pcVar6 = END_COLOR(pCVar11);
            pcVar7 = get_descr_form(victim,pCVar11,false);
            in_stack_fffffffffffffb78 = (char *)CONCAT44(uVar15,uVar10);
            sprintf(local_338,"$n %s%s%s %s%c",pcVar5,local_478,pcVar6,pcVar7,
                    in_stack_fffffffffffffb78);
          }
          else {
            pcVar5 = get_descr_form(victim,pCVar11,false);
            sprintf(local_338,"$n\'s assault slays %s outright!",pcVar5);
          }
          act(local_338,ch,(void *)0x0,pCVar11,2);
        }
        pCVar11 = pCVar11->next_in_room;
      } while (pCVar11 != (CHAR_DATA *)0x0);
    }
    pcVar5 = get_char_color(ch,"damage");
    pcVar6 = END_COLOR(ch);
    sprintf(local_438,"You %s%s%s $N%c",pcVar5,pcVar13,pcVar6,(ulong)local_46c);
    pcVar6 = get_char_color(victim,"damage");
    pcVar7 = END_COLOR(victim);
    __format = "$n %s%s%s you%c";
    pcVar5 = local_238;
    pcVar13 = local_478;
LAB_00291561:
    sprintf(pcVar5,__format,pcVar6,pcVar13,pcVar7);
  }
  pcVar5 = (char *)0x0;
  bVar1 = false;
  bVar2 = false;
LAB_00291d05:
  bVar3 = str_cmp(pcVar5,"");
  if (!bVar3) {
    sprintf(local_138,"Log: Damage without noun. Char: %s, Victim: %s, DT: %d",ch->true_name,
            victim->true_name);
    wiznet(local_138,(CHAR_DATA *)0x0,(OBJ_DATA *)0x0,0x16,0,0);
  }
  if (ch == victim) {
    act_new(local_438,ch,(void *)0x0,(void *)0x0,3,2);
  }
  else {
    if ((!bVar1) || (ch->in_room == victim->in_room)) {
      act(local_438,ch,(void *)0x0,victim,3);
    }
    act(local_238,ch,(void *)0x0,victim,2);
  }
  if (bVar2) {
    free_pstring(pcVar5);
  }
  return;
}

Assistant:

void dam_message(CHAR_DATA *ch, CHAR_DATA *victim, int dam, int dt, bool immune, char *dnoun, bool reduced)
{
	char buf1[256], buf2[256], buf3[256], buf97[256];
	OBJ_DATA *wield;
	CHAR_DATA *gch;
	const char *vs;
	const char *vp;
	char *attack = nullptr, *attack2;
	char punct;
	int prop;
	bool asterisk = false, duped = false;

	if (dam < 0)
		prop = 0;
	else
		prop = dam;

	if (ch == nullptr || victim == nullptr || !victim->in_room || !ch->in_room)
		return;

	if (reduced)
	{
		vs = "\x01B[0mfail to harm";
		vp = "\x01B[0mfails to harm";
	}
	else if (prop == 0)
	{
		vs = "miss";
		vp = "misses";
	}
	else if (prop <= 2)
	{
		vs = "scratch";
		vp = "scratches";
	}
	else if (prop <= 4)
	{
		vs = "graze";
		vp = "grazes";
	}
	else if (prop <= 7)
	{
		vs = "hit";
		vp = "hits";
	}
	else if (prop <= 11)
	{
		vs = "injure";
		vp = "injures";
	}
	else if (prop <= 15)
	{
		vs = "wound";
		vp = "wounds";
	}
	else if (prop <= 20)
	{
		vs = "maul";
		vp = "mauls";
	}
	else if (prop <= 25)
	{
		vs = "decimate";
		vp = "decimates";
	}
	else if (prop <= 30)
	{
		vs = "devastate";
		vp = "devastates";
	}
	else if (prop <= 37)
	{
		vs = "maim";
		vp = "maims";
	}
	else if (prop <= 45)
	{
		vs = "MUTILATE";
		vp = "MUTILATES";
	}
	else if (prop <= 55)
	{
		vs = "EVISCERATE";
		vp = "EVISCERATES";
	}
	else if (prop <= 65)
	{
		vs = "DISMEMBER";
		vp = "DISMEMBERS";
	}
	else if (prop <= 85)
	{
		vs = "MASSACRE";
		vp = "MASSACRES";
	}
	else if (prop <= 100)
	{
		vs = "MANGLE";
		vp = "MANGLES";
	}
	else if (prop <= 135)
	{
		vs = "*** DEMOLISH ***";
		vp = "*** DEMOLISHES ***";
	}
	else if (prop <= 160)
	{
		vs = "*** DEVASTATE ***";
		vp = "*** DEVASTATES ***";
	}
	else if (prop <= 250)
	{
		vs = "=== OBLITERATE ===";
		vp = "=== OBLITERATES ===";
	}
	else if (prop <= 330)
	{
		vs = ">>> ANNIHILATE <<<";
		vp = ">>> ANNIHILATES <<<";
	}
	else if (prop <= 380)
	{
		vs = "<<< ERADICATE >>>";
		vp = "<<< ERADICATES >>>";
	}
	else
	{
		vs = "do UNSPEAKABLE things to";
		vp = "does UNSPEAKABLE things to";
	}

	punct = (prop <= 33) ? '.' : '!';

	/* Now quickly set dual wield weapon dt to real weapon dt - this allows
	dual wielded weapons to be kept track of until this point, now we no
	longer need to know if the weapon doing the dam is the dual one, just what
	it's actual dt is
	-Ceran
	*/
	if (dt == gsn_dual_wield)
	{
		if (dt == gsn_dual_wield)
			wield = get_eq_char(ch, WEAR_DUAL_WIELD);

		dt = TYPE_HIT;

		if (wield != nullptr)
			dt += wield->value[3];
		else
			dt += ch->dam_type;
	}

	if (dt == TYPE_HIT)
	{
		if (ch == victim)
		{
			if (prop < victim->max_hit)
			{
				sprintf(buf1, "$n %s $mself%c", vp, punct);
				sprintf(buf2, "You %s%s%s yourself%c", get_char_color(ch, "damage"), vs, END_COLOR(ch), punct);
			}
			else
			{
				sprintf(buf1, "$n's assault slays $mself outright!");
				sprintf(buf2, "Your assault slays you outright!");
			}
		}
		else
		{
			for (gch = victim->in_room->people; gch != nullptr; gch = gch->next_in_room)
			{
				if (gch != ch && gch != victim)
				{
					if (prop < victim->max_hit)
					{
						sprintf(buf1, "$n %s%s%s %s%c", get_char_color(gch, "damage"), vp, END_COLOR(gch), get_descr_form(victim, gch, false), punct);
						act(buf1, ch, nullptr, gch, TO_VICT);
					}
					else
					{
						sprintf(buf1, "$n's assault slays %s outright!", get_descr_form(victim, gch, false));
						act(buf1, ch, nullptr, gch, TO_VICT);
					}
				}
			}

			sprintf(buf2, "You %s%s%s $N%c", get_char_color(ch, "damage"), vs, END_COLOR(ch), punct);
			sprintf(buf3, "$n %s%s%s you%c", get_char_color(victim, "damage"), vp, END_COLOR(victim), punct);
		}
	}
	else
	{
		if (dt >= 0 && dt < MAX_SKILL)
		{
			attack = skill_table[dt].noun_damage;
		}
		else if (dt >= TYPE_HIT && dt < TYPE_HIT + MAX_DAMAGE_MESSAGE)
		{
			attack = attack_table[dt - TYPE_HIT].noun;
		}
		else
		{
			dt = TYPE_HIT + 17;
			attack = attack_table[0].noun;
		}

		if (dnoun)
		{
			duped = true;
			attack = palloc_string(dnoun);
		}

		if (attack && attack[strlen(attack) - 1] == '$')
		{
			vp = vs;
			attack2 = palloc_string(attack);

			chop(attack2);

			if (duped)
				free_pstring(attack);

			attack = palloc_string(attack2);
			free_pstring(attack2);
		}
		else if (attack && attack[strlen(attack) - 1] == '#')
		{
			vs = vp;
			attack2 = palloc_string(attack);
			chop(attack2);

			if (duped)
				free_pstring(attack);

			attack = palloc_string(attack2);
			free_pstring(attack2);
		}

		if (immune)
		{
			if (attack && attack[strlen(attack) - 1] == '*')
			{
				attack2 = palloc_string(attack);
				chop(attack2);

				if (duped)
					free_pstring(attack);

				attack = palloc_string(attack2);
				duped = true;

				free_pstring(attack2);

				asterisk = true;

				sprintf(buf1, "$N is unaffected by %s!", attack);
				if (ch == victim)
					sprintf(buf2, "You are unaffected by %s!", attack);
				else
					sprintf(buf2, "$N is unaffected by %s!", attack);

				sprintf(buf3, "You are unaffected by %s!", attack);
			}
			else
			{
				if (ch == victim)
				{
					sprintf(buf1, "$n is unaffected by $s %s.", attack);
					sprintf(buf2, "You are unaffected by your %s.", attack);
				}
				else
				{
					sprintf(buf1, "$N is unaffected by $n's %s!", attack);
					sprintf(buf2, "$N is unaffected by your %s!", attack);
					sprintf(buf3, "You are unaffected by $n's %s!", attack);
				}
			}
		}
		else
		{
			if (attack && attack[strlen(attack) - 1] == '*')
			{
				attack2 = palloc_string(attack);
				chop(attack2);

				if (duped)
					free_pstring(attack);

				attack = palloc_string(attack2);
				duped = true;

				free_pstring(attack2);
				asterisk = true;

				for (gch = victim->in_room->people; gch != nullptr; gch = gch->next_in_room)
				{
					if (gch != ch && gch != victim)
					{
						if (prop < victim->max_hit)
						{
							sprintf(buf1, "%s %s%s%s %s%c",
								attack,
								get_char_color(gch, "damage"),
								vp,
								END_COLOR(gch),
								get_descr_form(victim, gch, false),
								punct);
						}
						else
						{
							sprintf(buf1, "%s slays %s outright!", attack, get_descr_form(victim, gch, false));
						}

						act(buf1, ch, nullptr, gch, TO_VICT);
					}
				}

				if (ch == victim)
				{
					if (prop < victim->max_hit)
					{
						sprintf(buf2, "%s %s%s%s you%c",
							attack,
							get_char_color(ch, "damage"),
							vp,
							END_COLOR(ch),
							punct);
					}
					else
					{
						sprintf(buf2, "%s slays you outright!", attack);
					}
				}
				else
				{
					if (prop < victim->max_hit)
					{
						sprintf(buf2, "%s %s%s%s $N%c",
							attack,
							get_char_color(ch, "damage"),
							vp,
							END_COLOR(ch),
							punct);
					}
					else
					{
						sprintf(buf2, "%s slays $N outright!", attack);
					}
				}

				if (prop < victim->max_hit)
				{
					sprintf(buf3, "%s %s%s%s you%c",
						attack,
						get_char_color(victim, "damage"),
						vp,
						END_COLOR(victim),
						punct);
				}
				else
				{
					sprintf(buf3, "%s slays you outright!", attack);
				}
			}
			else if (ch == victim)
			{
				for (gch = victim->in_room->people; gch != nullptr; gch = gch->next_in_room)
				{
					if (gch != ch && gch != victim)
					{
						if (prop < victim->max_hit)
						{
							sprintf(buf1, "$n's %s %s%s%s $m%c",
								attack,
								get_char_color(gch, "damage"),
								vp,
								END_COLOR(gch),
								punct);
						}
						else
						{
							sprintf(buf1, "$n's %s slays $m outright!", attack);
						}

						act(buf1, ch, nullptr, gch, TO_VICT);
					}
				}

				if (prop < victim->max_hit)
				{
					sprintf(buf2, "Your %s %s%s%s you%c",
						attack,
						get_char_color(ch, "damage"),
						vp,
						END_COLOR(ch),
						punct);
				}
				else
				{
					sprintf(buf2, "Your %s slays you outright!", attack);
				}
			}
			else
			{
				for (gch = victim->in_room->people; gch != nullptr; gch = gch->next_in_room)
				{
					if (gch != ch && gch != victim)
					{
						if (prop < victim->max_hit)
						{
							sprintf(buf1, "$n's %s %s%s%s %s%c",
								attack,
								get_char_color(gch, "damage"),
								vp,
								END_COLOR(gch),
								get_descr_form(victim, gch, false),
								punct);
						}
						else
						{
							sprintf(buf1, "$n's %s slays %s outright!", attack, get_descr_form(victim, gch, false));
						}

						act(buf1, ch, nullptr, gch, TO_VICT);
					}
				}

				if (prop < victim->max_hit)
				{
					sprintf(buf2, "Your %s %s%s%s $N%c",
						attack,
						get_char_color(ch, "damage"),
						vp,
						END_COLOR(ch),
						punct);
				}
				else
				{
					sprintf(buf2, "Your %s slays $N outright!", attack);
				}

				if (prop < victim->max_hit)
				{
					sprintf(buf3, "$n's %s \%s%s%s you%c",
						attack,
						get_char_color(victim, "damage"),
						vp,
						END_COLOR(victim),
						punct);
				}
				else
				{
					sprintf(buf3, "$n's %s slays you outright!", attack);
				}
			}
		}
	}

	if (!str_cmp(attack, ""))
	{
		sprintf(buf97, "Log: Damage without noun. Char: %s, Victim: %s, DT: %d", ch->true_name, victim->true_name, dt);
		wiznet(buf97, nullptr, nullptr, WIZ_LOG, 0, 0);
	}

	if (ch == victim)
	{
		act_new(buf2, ch, nullptr, nullptr, TO_CHAR, POS_INCAP);
	}
	else
	{
		if (!(asterisk && ch->in_room != victim->in_room))
			act(buf2, ch, nullptr, victim, TO_CHAR);

		act(buf3, ch, nullptr, victim, TO_VICT);
	}

	if (duped)
		free_pstring(attack);
}